

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_insert_h_mipsel(CPUMIPSState_conflict4 *env,uint32_t wd,uint32_t rs_num,uint32_t n)

{
  *(short *)((long)(env->active_fpu).fpr + (ulong)(n & 7) * 2 + (ulong)wd * 0x10) =
       (short)(env->active_tc).gpr[rs_num];
  return;
}

Assistant:

void helper_msa_insert_h(CPUMIPSState *env, uint32_t wd,
                          uint32_t rs_num, uint32_t n)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    target_ulong rs = env->active_tc.gpr[rs_num];
    n %= 8;
#if defined(HOST_WORDS_BIGENDIAN)
    if (n < 4) {
        n = 4 - n - 1;
    } else {
        n = 12 - n - 1;
    }
#endif
    pwd->h[n] = (int16_t)rs;
}